

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

string_view __thiscall
google::protobuf::Reflection::GetStringView
          (Reflection *this,Message *message,FieldDescriptor *field,ScratchSpace *scratch)

{
  byte bVar1;
  Descriptor *pDVar2;
  char *description;
  Metadata MVar3;
  string_view sVar4;
  
  MVar3 = Message::GetMetadata(message);
  if (MVar3.reflection != this) {
LAB_0029dac2:
    pDVar2 = this->descriptor_;
    MVar3 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar2,MVar3.descriptor,field,"GetStringView")
    ;
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ == pDVar2) {
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
      GetStringView();
      goto LAB_0029dac2;
    }
    if ((bVar1 & 0x20) == 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 9) {
        sVar4 = GetStringViewImpl(this,message,field,scratch);
        return sVar4;
      }
      anon_unknown_6::ReportReflectionUsageTypeError(pDVar2,field,"GetStringView",CPPTYPE_STRING);
    }
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"GetStringView",description);
}

Assistant:

absl::string_view Reflection::GetStringView(const Message& message,
                                            const FieldDescriptor* field,
                                            ScratchSpace& scratch) const {
  USAGE_CHECK_ALL(GetStringView, SINGULAR, STRING);
  return GetStringViewImpl(message, field, &scratch);
}